

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O2

int g_write(lua_State *L,FILE *f,int arg)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t in_RAX;
  lua_Integer lVar4;
  char *__ptr;
  size_t sVar5;
  size_t l;
  
  l = in_RAX;
  iVar2 = lua_gettop(L);
  bVar1 = true;
  for (; iVar2 != arg; arg = arg + 1) {
    iVar3 = lua_type(L,arg);
    if (iVar3 == 3) {
      iVar3 = lua_isinteger(L,arg);
      if (iVar3 == 0) {
        lua_tonumberx(L,arg,(int *)0x0);
        iVar3 = fprintf((FILE *)f,"%.14g");
      }
      else {
        lVar4 = lua_tointegerx(L,arg,(int *)0x0);
        iVar3 = fprintf((FILE *)f,"%lld",lVar4);
      }
      bVar1 = 0 < iVar3 && bVar1;
    }
    else {
      __ptr = luaL_checklstring(L,arg,&l);
      if (bVar1) {
        sVar5 = fwrite(__ptr,1,l,(FILE *)f);
        bVar1 = sVar5 == l;
      }
      else {
        bVar1 = false;
      }
    }
  }
  if (bVar1) {
    iVar2 = 1;
  }
  else {
    iVar2 = luaL_fileresult(L,0,(char *)0x0);
  }
  return iVar2;
}

Assistant:

static int g_write (lua_State *L, FILE *f, int arg) {
  int nargs = lua_gettop(L) - arg;
  int status = 1;
  for (; nargs--; arg++) {
    if (lua_type(L, arg) == LUA_TNUMBER) {
      /* optimization: could be done exactly as for strings */
      int len = lua_isinteger(L, arg)
                ? fprintf(f, LUA_INTEGER_FMT,
                             (LUAI_UACINT)lua_tointeger(L, arg))
                : fprintf(f, LUA_NUMBER_FMT,
                             (LUAI_UACNUMBER)lua_tonumber(L, arg));
      status = status && (len > 0);
    }
    else {
      size_t l;
      const char *s = luaL_checklstring(L, arg, &l);
      status = status && (fwrite(s, sizeof(char), l, f) == l);
    }
  }
  if (status) return 1;  /* file handle already on stack top */
  else return luaL_fileresult(L, status, NULL);
}